

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v6::detail::
int_writer<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char,_unsigned_long>::on_dec
          (int_writer<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char,_unsigned_long>
           *this)

{
  basic_format_specs<char> *specs;
  size_t sVar1;
  bool bVar2;
  char *__dest;
  long lVar3;
  ulong uVar4;
  undefined1 *puVar5;
  byte bVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  char *pcVar10;
  uint uVar11;
  ptrdiff_t _Num;
  ulong __n;
  string_view prefix;
  write_int_data<char> data;
  char buffer [40];
  char *in_stack_ffffffffffffff68;
  buffer<char> *pbVar12;
  write_int_data<char> local_68;
  undefined1 local_58 [40];
  
  uVar4 = this->abs_value | 1;
  lVar3 = 0x3f;
  if (uVar4 != 0) {
    for (; uVar4 >> lVar3 == 0; lVar3 = lVar3 + -1) {
    }
  }
  uVar11 = ((uint)lVar3 ^ 0xffffffc0) * 0x4d1 + 0x13911 >> 0xc;
  uVar11 = (uVar11 + 1) -
           (uint)(this->abs_value <
                 *(ulong *)(basic_data<void>::zero_or_powers_of_10_64 + (ulong)uVar11 * 8));
  pbVar12 = (this->out).container;
  specs = this->specs;
  pcVar10 = this->prefix;
  uVar8 = (ulong)this->prefix_size;
  prefix.size_._0_4_ = this->prefix_size;
  prefix.data_ = pcVar10;
  prefix.size_._4_4_ = 0;
  write_int_data<char>::write_int_data(&local_68,uVar11,prefix,specs);
  uVar4 = (ulong)specs->width;
  if ((long)uVar4 < 0) {
    assert_fail(pcVar10,0,in_stack_ffffffffffffff68);
  }
  uVar7 = 0;
  if (local_68.size <= uVar4) {
    uVar7 = uVar4 - local_68.size;
  }
  uVar4 = uVar7 >> (*(byte *)((long)&basic_data<void>::right_padding_shifts +
                             (ulong)((byte)specs->field_0x9 & 0xf)) & 0x3f);
  sVar1 = pbVar12->size_;
  uVar9 = local_68.size + sVar1 + (specs->fill).size_ * uVar7;
  if (pbVar12->capacity_ < uVar9) {
    (**pbVar12->_vptr_buffer)(pbVar12,uVar9);
  }
  pbVar12->size_ = uVar9;
  __dest = fill<char*,char>(pbVar12->ptr_ + sVar1,uVar4,&specs->fill);
  if (uVar8 != 0) {
    memmove(__dest,pcVar10,uVar8);
    __dest = __dest + uVar8;
  }
  pcVar10 = __dest;
  if (local_68.padding != 0) {
    pcVar10 = __dest + local_68.padding;
    memset(__dest,0x30,local_68.padding);
  }
  uVar8 = this->abs_value;
  __n = (ulong)uVar11;
  puVar5 = local_58 + __n;
  uVar9 = uVar8;
  if (99 < uVar8) {
    do {
      uVar8 = uVar9 / 100;
      *(undefined2 *)(puVar5 + -2) =
           *(undefined2 *)
            (basic_data<void>::digits + (ulong)(uint)((int)uVar9 + (int)uVar8 * -100) * 2);
      puVar5 = puVar5 + -2;
      bVar2 = 9999 < uVar9;
      uVar9 = uVar8;
    } while (bVar2);
  }
  if (uVar8 < 10) {
    bVar6 = (byte)uVar8 | 0x30;
    lVar3 = -1;
  }
  else {
    puVar5[-1] = basic_data<void>::digits[(uVar8 * 2 & 0xffffffff) + 1];
    bVar6 = basic_data<void>::digits[uVar8 * 2 & 0x1fffffffe];
    lVar3 = -2;
  }
  puVar5[lVar3] = bVar6;
  if (uVar11 != 0) {
    memmove(pcVar10,local_58,__n);
  }
  fill<char*,char>(pcVar10 + __n,uVar7 - uVar4,&specs->fill);
  (this->out).container = pbVar12;
  return;
}

Assistant:

void on_dec() {
    auto num_digits = count_digits(abs_value);
    out = write_int(out, num_digits, get_prefix(), specs,
                    [this, num_digits](iterator it) {
                      return format_decimal<Char>(it, abs_value, num_digits);
                    });
  }